

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O0

FT_Error tt_sbit_decoder_load_compound
                   (TT_SBitDecoder decoder,FT_Byte *p,FT_Byte *limit,FT_Int x_pos,FT_Int y_pos,
                   FT_UInt recurse_count)

{
  FT_Byte *pFVar1;
  FT_Byte FVar2;
  FT_Byte FVar3;
  FT_Byte FVar4;
  FT_Short FVar5;
  FT_Short FVar6;
  ushort uVar7;
  FT_Short FVar8;
  FT_Short FVar9;
  ushort uVar10;
  FT_Byte *pFVar11;
  FT_Byte *pFVar12;
  FT_Char dy;
  FT_Char dx;
  FT_UInt gindex;
  FT_Byte vertAdvance;
  uint uStack_38;
  FT_Char vertBearingY;
  FT_Char vertBearingX;
  FT_Byte horiAdvance;
  FT_Char horiBearingY;
  FT_Char horiBearingX;
  FT_UInt nn;
  FT_UInt num_components;
  FT_Error error;
  FT_UInt recurse_count_local;
  FT_Int y_pos_local;
  FT_Int x_pos_local;
  FT_Byte *limit_local;
  FT_Byte *p_local;
  TT_SBitDecoder decoder_local;
  
  nn = 0;
  FVar5 = decoder->metrics->horiBearingX;
  FVar6 = decoder->metrics->horiBearingY;
  uVar7 = decoder->metrics->horiAdvance;
  FVar8 = decoder->metrics->vertBearingX;
  FVar9 = decoder->metrics->vertBearingY;
  uVar10 = decoder->metrics->vertAdvance;
  if (p + 2 <= limit) {
    limit_local = p + 2;
    FVar2 = *p;
    FVar3 = p[1];
    if (limit_local + (ulong)CONCAT11(FVar2,FVar3) * 4 <= limit) {
      for (uStack_38 = 0; uStack_38 < CONCAT11(FVar2,FVar3); uStack_38 = uStack_38 + 1) {
        pFVar11 = limit_local + 2;
        FVar4 = *limit_local;
        pFVar1 = limit_local + 1;
        pFVar12 = limit_local + 3;
        limit_local = limit_local + 4;
        nn = tt_sbit_decoder_load_image
                       (decoder,(uint)CONCAT11(FVar4,*pFVar1),x_pos + (char)*pFVar11,
                        y_pos + (char)*pFVar12,recurse_count + 1,'\0');
        if (nn != 0) break;
      }
      decoder->metrics->horiBearingX = (short)(char)FVar5;
      decoder->metrics->horiBearingY = (short)(char)FVar6;
      decoder->metrics->horiAdvance = uVar7 & 0xff;
      decoder->metrics->vertBearingX = (short)(char)FVar8;
      decoder->metrics->vertBearingY = (short)(char)FVar9;
      decoder->metrics->vertAdvance = uVar10 & 0xff;
      decoder->metrics->width = (ushort)decoder->bitmap->width & 0xff;
      decoder->metrics->height = (ushort)decoder->bitmap->rows & 0xff;
      return nn;
    }
  }
  return 3;
}

Assistant:

static FT_Error
  tt_sbit_decoder_load_compound( TT_SBitDecoder  decoder,
                                 FT_Byte*        p,
                                 FT_Byte*        limit,
                                 FT_Int          x_pos,
                                 FT_Int          y_pos,
                                 FT_UInt         recurse_count )
  {
    FT_Error  error = FT_Err_Ok;
    FT_UInt   num_components, nn;

    FT_Char  horiBearingX = (FT_Char)decoder->metrics->horiBearingX;
    FT_Char  horiBearingY = (FT_Char)decoder->metrics->horiBearingY;
    FT_Byte  horiAdvance  = (FT_Byte)decoder->metrics->horiAdvance;
    FT_Char  vertBearingX = (FT_Char)decoder->metrics->vertBearingX;
    FT_Char  vertBearingY = (FT_Char)decoder->metrics->vertBearingY;
    FT_Byte  vertAdvance  = (FT_Byte)decoder->metrics->vertAdvance;


    if ( p + 2 > limit )
      goto Fail;

    num_components = FT_NEXT_USHORT( p );
    if ( p + 4 * num_components > limit )
    {
      FT_TRACE1(( "tt_sbit_decoder_load_compound: broken table\n" ));
      goto Fail;
    }

    FT_TRACE3(( "tt_sbit_decoder_load_compound: loading %d component%s\n",
                num_components,
                num_components == 1 ? "" : "s" ));

    for ( nn = 0; nn < num_components; nn++ )
    {
      FT_UInt  gindex = FT_NEXT_USHORT( p );
      FT_Char  dx     = FT_NEXT_CHAR( p );
      FT_Char  dy     = FT_NEXT_CHAR( p );


      /* NB: a recursive call */
      error = tt_sbit_decoder_load_image( decoder,
                                          gindex,
                                          x_pos + dx,
                                          y_pos + dy,
                                          recurse_count + 1,
                                          /* request full bitmap image */
                                          FALSE );
      if ( error )
        break;
    }

    FT_TRACE3(( "tt_sbit_decoder_load_compound: done\n" ));

    decoder->metrics->horiBearingX = horiBearingX;
    decoder->metrics->horiBearingY = horiBearingY;
    decoder->metrics->horiAdvance  = horiAdvance;
    decoder->metrics->vertBearingX = vertBearingX;
    decoder->metrics->vertBearingY = vertBearingY;
    decoder->metrics->vertAdvance  = vertAdvance;
    decoder->metrics->width        = (FT_Byte)decoder->bitmap->width;
    decoder->metrics->height       = (FT_Byte)decoder->bitmap->rows;

  Exit:
    return error;

  Fail:
    error = FT_THROW( Invalid_File_Format );
    goto Exit;
  }